

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * get_option_arg(int argc,char **argv,int *i)

{
  int iVar1;
  ushort **ppuVar2;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  char *local_8;
  
  if (*(char *)(*(long *)(in_RSI + (long)*in_RDX * 8) + 2) == '\0') {
    iVar1 = *in_RDX;
    *in_RDX = iVar1 + 1;
    if ((iVar1 + 1 < in_EDI) &&
       ((**(char **)(in_RSI + (long)*in_RDX * 8) != '-' ||
        (ppuVar2 = __ctype_b_loc(),
        ((*ppuVar2)[(int)(uint)*(byte *)(*(long *)(in_RSI + (long)*in_RDX * 8) + 1)] & 0x800) != 0))
       )) {
      local_8 = *(char **)(in_RSI + (long)*in_RDX * 8);
    }
    else {
      *in_RDX = *in_RDX + -1;
      error(5,(ulong)(uint)(int)*(char *)(*(long *)(in_RSI + (long)*in_RDX * 8) + 1));
      local_8 = (char *)0x0;
    }
  }
  else {
    local_8 = (char *)(*(long *)(in_RSI + (long)*in_RDX * 8) + 2);
  }
  return local_8;
}

Assistant:

static char *get_option_arg(int argc,char *argv[],int *i)
/* get pointer to the string, which either directly follows the option
   character or is stored in the next argument */
{
  if (argv[*i][2])
    return &argv[*i][2];
  else {
    if (++*i<argc) {
      /* another option? */
      if (argv[*i][0]!='-' || isdigit((unsigned char)argv[*i][1]))
        return argv[*i];
    }
    --*i;
  }
  error(5,argv[*i][1]);
  return NULL;  /* not reached */
}